

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O1

void rw::skinAlways(void *object,int32 param_2,int32 param_3)

{
  if ((*(long *)((long)object + 0x28) != 0) &&
     (*(long *)(*(long *)((long)object + 0x28) + (long)skinGlobals) != 0)) {
    *(undefined8 *)((long)object + 0x68) = (&DAT_0014a2a8)[platform];
  }
  return;
}

Assistant:

static void
skinAlways(void *object, int32, int32)
{
	Atomic *atomic = (Atomic*)object;
	Geometry *geo = atomic->geometry;
	if(geo == nil) return;
	Skin *skin = Skin::get(geo);
	if(skin == nil) return;
	Skin::setPipeline((Atomic*)object, 1);
}